

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

char * build_ustar_entry_name(char *dest,char *src,size_t src_length,char *insert)

{
  char *__src;
  byte bVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  
  if (insert == (char *)0x0) {
    if (src_length < 100 && insert == (char *)0x0) {
      strncpy(dest,src,src_length);
      pcVar11 = dest + src_length;
      goto LAB_00346003;
    }
    lVar3 = 0;
  }
  else {
    sVar2 = strlen(insert);
    lVar3 = sVar2 + 2;
  }
  bVar1 = 1;
  while (bVar5 = bVar1, sVar8 = src_length, 0 < (long)sVar8) {
    src_length = sVar8 - 1;
    bVar1 = 0;
    if (src[sVar8 - 1] != '/') {
      if ((sVar8 == 1) || (src[sVar8 - 1] != '.')) break;
      src_length = sVar8 - 2;
      bVar1 = 0;
      if (src[sVar8 - 2] != '/') break;
    }
  }
  uVar4 = sVar8 - 1;
  uVar6 = (long)uVar4 >> 0x3f & uVar4;
  lVar9 = 0;
  for (; (uVar7 = uVar6, 0 < (long)uVar4 && (uVar7 = uVar4, src[uVar4] != '/')); uVar4 = uVar4 - 1)
  {
    lVar9 = lVar9 + 1;
  }
  lVar9 = (lVar9 != 0 && src[uVar4] == '/') + uVar7;
  __src = src + lVar9;
  lVar3 = ((ulong)bVar5 | 0x62) - lVar3;
  pcVar11 = src + sVar8;
  if (__src + lVar3 < src + sVar8) {
    pcVar11 = __src + lVar3;
  }
  sVar2 = (long)pcVar11 - (long)__src;
  pcVar13 = src + 0x9b;
  if (lVar9 < 0x9b) {
    pcVar13 = __src;
  }
  for (; (src < pcVar13 && (*pcVar13 != '/')); pcVar13 = pcVar13 + -1) {
  }
  if (pcVar13 < __src) {
    pcVar13 = pcVar13 + (*pcVar13 == '/');
  }
  pcVar12 = pcVar13 + (lVar3 - sVar2);
  if (__src < pcVar13 + (lVar3 - sVar2)) {
    pcVar12 = __src;
  }
  if (pcVar12 < pcVar13) {
    pcVar12 = pcVar13;
  }
  for (; (pcVar13 < pcVar12 && (*pcVar12 != '/')); pcVar12 = pcVar12 + -1) {
  }
  if (pcVar12 < __src) {
    pcVar12 = pcVar12 + (*pcVar12 == '/');
  }
  sVar10 = (long)pcVar13 - (long)src;
  pcVar11 = dest;
  if (src <= pcVar13 && sVar10 != 0) {
    strncpy(dest,src,sVar10);
    pcVar11 = dest + sVar10;
  }
  sVar10 = (long)pcVar12 - (long)pcVar13;
  if (pcVar13 <= pcVar12 && sVar10 != 0) {
    strncpy(pcVar11,pcVar13,sVar10);
    pcVar11 = pcVar11 + sVar10;
  }
  if (insert != (char *)0x0) {
    strcpy(pcVar11,insert);
    sVar10 = strlen(insert);
    pcVar13 = pcVar11 + sVar10;
    pcVar11 = pcVar13 + 1;
    *pcVar13 = '/';
  }
  strncpy(pcVar11,__src,sVar2);
  pcVar11 = pcVar11 + sVar2;
  if (bVar5 == 0) {
    *pcVar11 = '/';
    pcVar11 = pcVar11 + 1;
  }
LAB_00346003:
  *pcVar11 = '\0';
  return dest;
}

Assistant:

static char *
build_ustar_entry_name(char *dest, const char *src, size_t src_length,
    const char *insert)
{
	const char *prefix, *prefix_end;
	const char *suffix, *suffix_end;
	const char *filename, *filename_end;
	char *p;
	int need_slash = 0; /* Was there a trailing slash? */
	size_t suffix_length = 99;
	size_t insert_length;

	/* Length of additional dir element to be added. */
	if (insert == NULL)
		insert_length = 0;
	else
		/* +2 here allows for '/' before and after the insert. */
		insert_length = strlen(insert) + 2;

	/* Step 0: Quick bailout in a common case. */
	if (src_length < 100 && insert == NULL) {
		strncpy(dest, src, src_length);
		dest[src_length] = '\0';
		return (dest);
	}

	/* Step 1: Locate filename and enforce the length restriction. */
	filename_end = src + src_length;
	/* Remove trailing '/' chars and '/.' pairs. */
	for (;;) {
		if (filename_end > src && filename_end[-1] == '/') {
			filename_end --;
			need_slash = 1; /* Remember to restore trailing '/'. */
			continue;
		}
		if (filename_end > src + 1 && filename_end[-1] == '.'
		    && filename_end[-2] == '/') {
			filename_end -= 2;
			need_slash = 1; /* "foo/." will become "foo/" */
			continue;
		}
		break;
	}
	if (need_slash)
		suffix_length--;
	/* Find start of filename. */
	filename = filename_end - 1;
	while ((filename > src) && (*filename != '/'))
		filename --;
	if ((*filename == '/') && (filename < filename_end - 1))
		filename ++;
	/* Adjust filename_end so that filename + insert fits in 99 chars. */
	suffix_length -= insert_length;
	if (filename_end > filename + suffix_length)
		filename_end = filename + suffix_length;
	/* Calculate max size for "suffix" section (#3 above). */
	suffix_length -= filename_end - filename;

	/* Step 2: Locate the "prefix" section of the dirname, including
	 * trailing '/'. */
	prefix = src;
	prefix_end = prefix + 155;
	if (prefix_end > filename)
		prefix_end = filename;
	while (prefix_end > prefix && *prefix_end != '/')
		prefix_end--;
	if ((prefix_end < filename) && (*prefix_end == '/'))
		prefix_end++;

	/* Step 3: Locate the "suffix" section of the dirname,
	 * including trailing '/'. */
	suffix = prefix_end;
	suffix_end = suffix + suffix_length; /* Enforce limit. */
	if (suffix_end > filename)
		suffix_end = filename;
	if (suffix_end < suffix)
		suffix_end = suffix;
	while (suffix_end > suffix && *suffix_end != '/')
		suffix_end--;
	if ((suffix_end < filename) && (*suffix_end == '/'))
		suffix_end++;

	/* Step 4: Build the new name. */
	/* The OpenBSD strlcpy function is safer, but less portable. */
	/* Rather than maintain two versions, just use the strncpy version. */
	p = dest;
	if (prefix_end > prefix) {
		strncpy(p, prefix, prefix_end - prefix);
		p += prefix_end - prefix;
	}
	if (suffix_end > suffix) {
		strncpy(p, suffix, suffix_end - suffix);
		p += suffix_end - suffix;
	}
	if (insert != NULL) {
		/* Note: assume insert does not have leading or trailing '/' */
		strcpy(p, insert);
		p += strlen(insert);
		*p++ = '/';
	}
	strncpy(p, filename, filename_end - filename);
	p += filename_end - filename;
	if (need_slash)
		*p++ = '/';
	*p = '\0';

	return (dest);
}